

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

Buffer * buffer_create(size_t blksz,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  Buffer *__s;
  Buffer *buffer;
  void *d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_malloc m_local;
  size_t blksz_local;
  
  __s = (Buffer *)(*m)(0x38,d);
  if (__s != (Buffer *)0x0) {
    memset(__s,0,0x38);
    __s->block_size = blksz;
    __s->m = m;
    __s->f = f;
    __s->d = d;
  }
  return __s;
}

Assistant:

Buffer *buffer_create(size_t blksz, MOJOSHADER_malloc m,
                      MOJOSHADER_free f, void *d)
{
    Buffer *buffer = (Buffer *) m(sizeof (Buffer), d);
    if (buffer != NULL)
    {
        memset(buffer, '\0', sizeof (Buffer));
        buffer->block_size = blksz;
        buffer->m = m;
        buffer->f = f;
        buffer->d = d;
    } // if
    return buffer;
}